

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::WorkloadReferenceCase::init(WorkloadReferenceCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PerfCaseType PVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  AttribSpec *__args;
  ostringstream *poVar6;
  ostringstream vtx;
  ostringstream frag;
  AttribSpec local_3b0;
  Vec4 local_350;
  Vec4 local_340;
  Vec4 local_330;
  Vec4 local_320;
  undefined1 local_310 [376];
  undefined1 local_198 [376];
  
  PVar2 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar6 = (ostringstream *)local_198;
  if (PVar2 == CASETYPE_VERTEX) {
    poVar6 = (ostringstream *)local_310;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"in mediump vec4 a_value;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if (PVar2 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,"out mediump vec4 v_color;\n",0x1a);
    pcVar5 = "in mediump vec4 v_color;\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,"out mediump vec4 v_value;\n",0x1a);
    pcVar5 = "in mediump vec4 v_value;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar5,0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"\tmediump vec4 res;\n",0x13)
  ;
  pcVar5 = "v_value";
  if (PVar2 == CASETYPE_VERTEX) {
    pcVar5 = "a_value";
  }
  (*(this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,poVar6,"res",pcVar5);
  if (PVar2 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,"\tv_color = res;\n",0x10);
    lVar4 = 0x14;
    pcVar5 = "\to_color = v_color;\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,"\tv_value = a_value;\n",0x14);
    lVar4 = 0x10;
    pcVar5 = "\to_color = res;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             (string *)&local_3b0);
  paVar1 = &local_3b0.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0.name._M_dataplus._M_p,local_3b0.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             (string *)&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0.name._M_dataplus._M_p,local_3b0.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_320.m_data[0] = 0.0;
  local_320.m_data[1] = 0.1;
  local_320.m_data[2] = 0.2;
  local_320.m_data[3] = 0.3;
  local_330.m_data[0] = 0.4;
  local_330.m_data[1] = 0.5;
  local_330.m_data[2] = 0.6;
  local_330.m_data[3] = 0.7;
  local_340.m_data[0] = 0.8;
  local_340.m_data[1] = 0.9;
  local_340.m_data[2] = 1.0;
  local_340.m_data[3] = 1.1;
  local_350.m_data[0] = 1.2;
  local_350.m_data[1] = 1.3;
  local_350.m_data[2] = 1.4;
  local_350.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&local_3b0,"a_value",&local_320,&local_330,&local_340,&local_350);
  __args = &local_3b0;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,__args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.name._M_dataplus._M_p != paVar1) {
    __args = (AttribSpec *)(local_3b0.name.field_2._M_allocated_capacity + 1);
    operator_delete(local_3b0.name._M_dataplus._M_p,(ulong)__args);
  }
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
  iVar3 = std::ios_base::~ios_base((ios_base *)(local_310 + 0x70));
  return iVar3;
}

Assistant:

void WorkloadReferenceCase::init (void)
{
	bool isVertexCase = m_caseType == CASETYPE_VERTEX;

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op			= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	vtx << "in highp vec4 a_position;\n";	// Position attribute.
	vtx << "in mediump vec4 a_value;\n";	// Value for workload calculations.

	frag << "#version 300 es\n";
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "out mediump vec4 v_value;\n";
		frag << "in mediump vec4 v_value;\n";
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "\tmediump vec4 res;\n";
	writeWorkload(op, "res", isVertexCase ? "a_value" : "v_value");

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		vtx << "	v_value = a_value;\n";	// Transfer input to fragment shader through varying.
		frag << "	o_color = res;\n";	// Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	m_attributes.push_back(AttribSpec("a_value",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}